

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async_blocking_timeout.cpp
# Opt level: O2

bool __thiscall Client::Handshake(Client *this)

{
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  *this_00;
  ulong_long_type uVar1;
  bool bVar2;
  ostream *poVar3;
  error_code eVar4;
  error_code ec;
  lambda_functor<boost::lambda::lambda_functor_base<boost::lambda::other_action<boost::lambda::assignment_action>,_boost::tuples::tuple<boost::lambda::lambda_functor<boost::lambda::identity<boost::system::error_code_&>_>,_boost::lambda::lambda_functor<boost::lambda::placeholder<1>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>
  local_60 [2];
  string local_40 [32];
  
  local_60[0].
  super_lambda_functor_base<boost::lambda::other_action<boost::lambda::assignment_action>,_boost::tuples::tuple<boost::lambda::lambda_functor<boost::lambda::identity<boost::system::error_code_&>_>,_boost::lambda::lambda_functor<boost::lambda::placeholder<1>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
  .args.super_type.head.super_identity<boost::system::error_code_&>.elem =
       (identity<boost::system::error_code_&>)(error_code *)0x2540be400;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_after(&this->deadline_,(duration *)local_60);
  ec = boost::asio::error::make_error_code(try_again);
  this_00 = &this->ssl_socket_;
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::set_verify_mode(this_00,0);
  std::__cxx11::string::string(local_40,(string *)&this->host_);
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::set_verify_callback<boost::asio::ssl::host_name_verification>
            (this_00,(host_name_verification *)local_40);
  std::__cxx11::string::~string(local_40);
  local_60[0].
  super_lambda_functor_base<boost::lambda::other_action<boost::lambda::assignment_action>,_boost::tuples::tuple<boost::lambda::lambda_functor<boost::lambda::identity<boost::system::error_code_&>_>,_boost::lambda::lambda_functor<boost::lambda::placeholder<1>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
  .args.super_type.head.super_identity<boost::system::error_code_&>.elem =
       (identity<boost::system::error_code_&>)&ec;
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  async_handshake<boost::lambda::lambda_functor<boost::lambda::lambda_functor_base<boost::lambda::other_action<boost::lambda::assignment_action>,boost::tuples::tuple<boost::lambda::lambda_functor<boost::lambda::identity<boost::system::error_code&>>,boost::lambda::lambda_functor<boost::lambda::placeholder<1>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>const>
            ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)this_00,client,local_60);
  do {
    boost::asio::io_context::run_one(&this->io_context_);
    eVar4 = boost::asio::error::make_error_code(try_again);
    if (ec.val_ != eVar4.val_) break;
    uVar1 = (eVar4.cat_)->id_;
    bVar2 = (ec.cat_)->id_ == uVar1;
    if (uVar1 == 0) {
      bVar2 = ec.cat_ == eVar4.cat_;
    }
  } while (bVar2);
  if (ec.failed_ == true) {
    Stop(this);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Handshake failed: ");
    (*(ec.cat_)->_vptr_error_category[4])((string *)local_60,ec.cat_,(ulong)(uint)ec.val_);
    poVar3 = std::operator<<(poVar3,(string *)local_60);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    if (this->stopped_ != true) {
      return true;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"Handshake timed out.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return false;
}

Assistant:

bool Client::Handshake() {
  deadline_.expires_after(std::chrono::seconds(kMaxHandshakeSeconds));

  boost::system::error_code ec = boost::asio::error::would_block;

#if SSL_VERIFY
  ssl_socket_.set_verify_mode(ssl::verify_peer);
#else
  ssl_socket_.set_verify_mode(ssl::verify_none);
#endif  // SSL_VERIFY

  // ssl::host_name_verification has been added since Boost 1.73 to replace
  // ssl::rfc2818_verification.
#if BOOST_VERSION < 107300
  ssl_socket_.set_verify_callback(ssl::rfc2818_verification(host_));
#else
  ssl_socket_.set_verify_callback(ssl::host_name_verification(host_));
#endif  // BOOST_VERSION < 107300

  // HandshakeHandler: void (boost::system::error_code)
  ssl_socket_.async_handshake(ssl::stream_base::client,
                              boost::lambda::var(ec) = boost::lambda::_1);

  // Block until the asynchronous operation has completed.
  do {
    io_context_.run_one();
  } while (ec == boost::asio::error::would_block);

  if (ec) {
    Stop();
    std::cerr << "Handshake failed: " << ec.message() << std::endl;
    return false;
  }

  if (stopped_) {
    // |timed_out_| should be true in this case.
    std::cerr << "Handshake timed out." << std::endl;
    return false;
  }

  return true;
}